

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fft.c
# Opt level: O2

void aom_fft4x4_float_c(float *input,float *temp,float *output)

{
  aom_fft_2d_gen(input,temp,output,4,aom_fft1d_4_float,simple_transpose,unpack_2d_output,1);
  return;
}

Assistant:

void aom_fft4x4_float_c(const float *input, float *temp, float *output) {
  aom_fft_2d_gen(input, temp, output, 4, aom_fft1d_4_float, simple_transpose,
                 unpack_2d_output, 1);
}